

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

lua_Integer lua_tointegerx(lua_State *L,int idx,int *pisnum)

{
  int iVar1;
  TValue *obj;
  lua_Integer res;
  
  res = 0;
  obj = index2value(L,idx);
  if (obj->tt_ == '\x03') {
    res = (obj->value_).i;
    iVar1 = 1;
  }
  else {
    iVar1 = luaV_tointeger(obj,&res,F2Ieq);
  }
  if (pisnum != (int *)0x0) {
    *pisnum = iVar1;
  }
  return res;
}

Assistant:

LUA_API lua_Integer lua_tointegerx (lua_State *L, int idx, int *pisnum) {
  lua_Integer res = 0;
  const TValue *o = index2value(L, idx);
  int isnum = tointeger(o, &res);
  if (pisnum)
    *pisnum = isnum;
  return res;
}